

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvocationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InvocationExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ArgumentListSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ArgumentListSyntax **args_2)

{
  InvocationExpressionSyntax *pIVar1;
  size_t in_RDX;
  size_t in_RSI;
  BumpAllocator *in_RDI;
  
  pIVar1 = (InvocationExpressionSyntax *)allocate(in_RDI,in_RSI,in_RDX);
  slang::syntax::InvocationExpressionSyntax::InvocationExpressionSyntax
            ((InvocationExpressionSyntax *)this,args,args_1,(ArgumentListSyntax *)args_2);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }